

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldPtrsIteratorTest_RandomConstPtrAccess_Test::
RepeatedPtrFieldPtrsIteratorTest_RandomConstPtrAccess_Test
          (RepeatedPtrFieldPtrsIteratorTest_RandomConstPtrAccess_Test *this)

{
  RepeatedPtrFieldPtrsIteratorTest_RandomConstPtrAccess_Test *this_local;
  
  RepeatedPtrFieldPtrsIteratorTest::RepeatedPtrFieldPtrsIteratorTest
            (&this->super_RepeatedPtrFieldPtrsIteratorTest);
  (this->super_RepeatedPtrFieldPtrsIteratorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldPtrsIteratorTest_RandomConstPtrAccess_Test_029ebb28;
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldPtrsIteratorTest, RandomConstPtrAccess) {
  RepeatedPtrField<std::string>::const_pointer_iterator iter =
      const_proto_array_->pointer_begin();
  RepeatedPtrField<std::string>::const_pointer_iterator iter2 = iter;
  ++iter2;
  ++iter2;
  EXPECT_TRUE(iter + 2 == iter2);
  EXPECT_TRUE(iter == iter2 - 2);
  EXPECT_EQ("baz", *iter[2]);
  EXPECT_EQ("baz", **(iter + 2));
  EXPECT_EQ(3, const_proto_array_->end() - const_proto_array_->begin());
}